

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>::
double_writer::operator()
          (double_writer *this,ostream_iterator<char,_char,_std::char_traits<char>_> *it)

{
  ostream_iterator<char,_char,_std::char_traits<char>_> *this_00;
  ostream_iterator<char,_char,_std::char_traits<char>_> *in_RSI;
  long *in_RDI;
  char *in_stack_ffffffffffffffa8;
  ostream_iterator<char,_char,_std::char_traits<char>_> *in_stack_ffffffffffffffb0;
  ostream_iterator<char,_char,_std::char_traits<char>_> local_38;
  ostream_iterator<char,_char,_std::char_traits<char>_> *in_stack_ffffffffffffffd8;
  char *in_stack_ffffffffffffffe0;
  undefined7 in_stack_ffffffffffffffe8;
  undefined1 in_stack_ffffffffffffffef;
  
  if ((char)in_RDI[1] != '\0') {
    in_stack_ffffffffffffffef = (undefined1)in_RDI[1];
    this_00 = std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator++(in_RSI,0);
    std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator*(this_00);
    std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    *in_RDI = *in_RDI + -1;
  }
  internal::basic_buffer<char>::begin((basic_buffer<char> *)in_RDI[2]);
  internal::basic_buffer<char>::end((basic_buffer<char> *)in_RDI[2]);
  std::ostream_iterator<char,_char,_std::char_traits<char>_>::ostream_iterator(&local_38,in_RSI);
  internal::copy_str<char,char*,std::ostream_iterator<char,char,std::char_traits<char>>>
            ((char *)CONCAT17(in_stack_ffffffffffffffef,in_stack_ffffffffffffffe8),
             in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  in_RSI->_M_stream = (ostream_type *)in_stack_ffffffffffffffd8;
  in_RSI->_M_string = in_stack_ffffffffffffffe0;
  return;
}

Assistant:

void operator()(It &&it) {
      if (sign) {
        *it++ = static_cast<char_type>(sign);
        --n;
      }
      it = internal::copy_str<char_type>(buffer.begin(), buffer.end(), it);
    }